

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int wb_set_offset(archive_write *a,int64_t off)

{
  void *in_RSI;
  archive *in_RDI;
  int64_t ext_bytes;
  int64_t used;
  iso9660_conflict *iso9660;
  long local_30;
  long local_28;
  archive_write *a_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  a_00 = *(archive_write **)&in_RDI[1].current_codepage;
  if (*(int *)&a_00[0xec].filter_last == 1) {
    local_28 = 0x10000 - (long)a_00[0xec].filter_first;
    if ((long)a_00[0xec].format_init < (long)a_00[0xec].format_data + local_28) {
      a_00[0xec].format_init =
           (_func_int_archive_write_ptr *)((long)a_00[0xec].format_data + local_28);
    }
    if ((long)a_00[0xec].format_data < (long)a_00[0xec].format_name) {
      if ((0 < local_28) &&
         (iVar1 = write_to_temp((archive_write *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                                ,(size_t)in_RSI), iVar1 != 0)) {
        return -0x1e;
      }
      a_00[0xec].format_data = a_00[0xec].format_name;
      lseek(*(int *)&(a_00->archive).vtable,(__off_t)a_00[0xec].format_data,0);
      a_00[0xec].filter_first = (archive_write_filter *)0x10000;
      local_28 = 0;
    }
    if ((long)in_RSI < (long)a_00[0xec].format_data) {
      if ((0 < local_28) && (iVar1 = wb_write_out(a_00), iVar1 != 0)) {
        return -0x1e;
      }
      lseek(*(int *)&(a_00->archive).vtable,(__off_t)in_RSI,0);
      a_00[0xec].format_data = in_RSI;
      a_00[0xec].filter_first = (archive_write_filter *)0x10000;
    }
    else if ((long)a_00[0xec].format_init < (long)in_RSI) {
      a_00[0xec].filter_first =
           (archive_write_filter *)
           (0x10000 - ((long)a_00[0xec].format_init - (long)a_00[0xec].format_data));
      for (local_30 = (long)in_RSI - (long)a_00[0xec].format_init;
          (long)a_00[0xec].filter_first <= local_30;
          local_30 = local_30 - (long)a_00[0xec].filter_first) {
        iVar1 = write_null((archive_write *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           (size_t)in_RDI);
        if (iVar1 != 0) {
          return -0x1e;
        }
      }
      if ((0 < local_30) &&
         (iVar1 = write_null((archive_write *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (size_t)in_RDI), iVar1 != 0)) {
        return -0x1e;
      }
    }
    else {
      a_00[0xec].filter_first =
           (archive_write_filter *)(0x10000 - ((long)in_RSI - (long)a_00[0xec].format_data));
    }
    iVar1 = 0;
  }
  else {
    archive_set_error(in_RDI,-1,"Internal Programing error: iso9660:wb_set_offset()");
    iVar1 = -0x1e;
  }
  return iVar1;
}

Assistant:

static int
wb_set_offset(struct archive_write *a, int64_t off)
{
	struct iso9660 *iso9660 = (struct iso9660 *)a->format_data;
	int64_t used, ext_bytes;

	if (iso9660->wbuff_type != WB_TO_TEMP) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Internal Programing error: iso9660:wb_set_offset()");
		return (ARCHIVE_FATAL);
	}

	used = sizeof(iso9660->wbuff) - iso9660->wbuff_remaining;
	if (iso9660->wbuff_offset + used > iso9660->wbuff_tail)
		iso9660->wbuff_tail = iso9660->wbuff_offset + used;
	if (iso9660->wbuff_offset < iso9660->wbuff_written) {
		if (used > 0 &&
		    write_to_temp(a, iso9660->wbuff, (size_t)used) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		iso9660->wbuff_offset = iso9660->wbuff_written;
		lseek(iso9660->temp_fd, iso9660->wbuff_offset, SEEK_SET);
		iso9660->wbuff_remaining = sizeof(iso9660->wbuff);
		used = 0;
	}
	if (off < iso9660->wbuff_offset) {
		/*
		 * Write out waiting data.
		 */
		if (used > 0) {
			if (wb_write_out(a) != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
		}
		lseek(iso9660->temp_fd, off, SEEK_SET);
		iso9660->wbuff_offset = off;
		iso9660->wbuff_remaining = sizeof(iso9660->wbuff);
	} else if (off <= iso9660->wbuff_tail) {
		iso9660->wbuff_remaining = (size_t)
		    (sizeof(iso9660->wbuff) - (off - iso9660->wbuff_offset));
	} else {
		ext_bytes = off - iso9660->wbuff_tail;
		iso9660->wbuff_remaining = (size_t)(sizeof(iso9660->wbuff)
		   - (iso9660->wbuff_tail - iso9660->wbuff_offset));
		while (ext_bytes >= (int64_t)iso9660->wbuff_remaining) {
			if (write_null(a, (size_t)iso9660->wbuff_remaining)
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			ext_bytes -= iso9660->wbuff_remaining;
		}
		if (ext_bytes > 0) {
			if (write_null(a, (size_t)ext_bytes) != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
		}
	}
	return (ARCHIVE_OK);
}